

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_cbor_cursor<std::__cxx11::string_const&>
          (basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          cbor_decode_options *options,allocator<char> *alloc)

{
  uint uVar1;
  basic_staj_visitor<char> *in_RDI;
  allocator<char> *in_stack_00000028;
  cbor_decode_options *in_stack_00000030;
  allocator<char> *in_stack_00000070;
  basic_json_visitor<char> *in_stack_00000078;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *in_stack_00000080;
  
  ser_context::ser_context((ser_context *)&in_RDI[5].index_);
  basic_staj_cursor<char>::basic_staj_cursor((basic_staj_cursor<char> *)in_RDI);
  (in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor = (_func_int **)(vtable + 0x18);
  in_RDI[5].index_ = (size_t)(vtable + 0xb8);
  basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
  basic_cbor_parser<std::__cxx11::string_const&>
            ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)options,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)alloc,
             in_stack_00000030,in_stack_00000028);
  basic_staj_visitor<char>::basic_staj_visitor(in_RDI);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::
  basic_item_event_visitor_to_json_visitor(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  *(undefined1 *)&in_RDI[5].shape_.size_ = 0;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::cursor_mode
            ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)&in_RDI->event_,
             true);
  uVar1 = (*(in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor[7])();
  }
  return;
}

Assistant:

basic_cbor_cursor(Sourceable&& source,
        const cbor_decode_options& options = cbor_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc), 
          cursor_handler_adaptor_(cursor_visitor_, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }